

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

zt_mem_pool * zt_mem_pool_get(char *name)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  char *in_RDI;
  size_t olen;
  zt_mem_pool *pool;
  zt_elist_t *tmp;
  size_t nlen;
  zt_mem_pool *local_20;
  
  if (in_RDI != (char *)0x0) {
    __n = strlen(in_RDI);
    for (local_20 = (zt_mem_pool *)pools.next; local_20 != (zt_mem_pool *)&pools;
        local_20 = (zt_mem_pool *)(local_20->pool_list).next) {
      sVar2 = strlen(local_20->name);
      if ((sVar2 == __n) && (iVar1 = strncmp(in_RDI,local_20->name,__n), iVar1 == 0)) {
        return local_20;
      }
    }
  }
  return (zt_mem_pool *)0x0;
}

Assistant:

zt_mem_pool *
zt_mem_pool_get(char *name)
{
    size_t       nlen;
    zt_elist_t * tmp;

    if (!name) {
        return 0;
    }

    nlen = strlen(name);

    zt_elist_for_each(&pools, tmp) {
        zt_mem_pool * pool;
        size_t        olen;

        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        olen = strlen(pool->name);

        if (olen == nlen && (strncmp(name, pool->name, nlen) == 0)) {
            return pool;
        }
    }

    return 0;
}